

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O3

void hyperplane_dimension_order(double *angle_values,int *dims,int ndims,int *dimension_order)

{
  int *__last;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  int *piVar8;
  int *__i;
  int *__last_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_viennamapping[P]mpicartreorderlib_src_reordering_algorithms_hyperplane_hyperplane_cpp:49:4)>
  __comp_01;
  int *local_38;
  double *local_30;
  
  auVar5 = _DAT_00155010;
  if (0 < ndims) {
    lVar6 = (ulong)(uint)ndims - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00155010;
    auVar10 = _DAT_00155000;
    do {
      auVar11 = auVar10 ^ auVar5;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        dimension_order[uVar7] = (int)uVar7;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        dimension_order[uVar7 + 1] = (int)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar6 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar6 + 2;
    } while ((ndims + 1U & 0xfffffffe) != uVar7);
  }
  if (ndims != 0) {
    uVar7 = (ulong)ndims;
    __last = dimension_order + uVar7;
    lVar6 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    __comp._M_comp.dims = &local_38;
    __comp._M_comp.angle_values = &local_30;
    local_38 = dims;
    local_30 = angle_values;
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
              (dimension_order,__last,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,__comp);
    if (0x10 < ndims) {
      __last_00 = dimension_order + 0x10;
      __comp_00._M_comp.dims = &local_38;
      __comp_00._M_comp.angle_values = &local_30;
      std::
      __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
                (dimension_order,__last_00,__comp_00);
LAB_001325d3:
      iVar3 = *__last_00;
      dVar1 = angle_values[iVar3];
      piVar8 = __last_00;
      do {
        iVar4 = piVar8[-1];
        dVar2 = angle_values[iVar4];
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          if (dVar2 <= dVar1) goto LAB_00132611;
        }
        else if (dims[iVar3] <= dims[iVar4]) goto LAB_00132611;
        *piVar8 = iVar4;
        piVar8 = piVar8 + -1;
      } while( true );
    }
    __comp_01._M_comp.dims = &local_38;
    __comp_01._M_comp.angle_values = &local_30;
    std::
    __insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<hyperplane_dimension_order(double_const*,int_const*,int,int*)::__0>>
              (dimension_order,__last,__comp_01);
  }
  return;
LAB_00132611:
  *piVar8 = iVar3;
  __last_00 = __last_00 + 1;
  if (__last_00 == __last) {
    return;
  }
  goto LAB_001325d3;
}

Assistant:

void hyperplane_dimension_order(const double angle_values[],
				const int dims[],
				const int ndims,
				int dimension_order[]) {
  //O(n)
  for (int i = 0; i < ndims; i++) {
	dimension_order[i] = i;
  }

  // O ( ndims log (ndims) )
  //Sort the dimension_order vector based on the values in angle_values
  std::sort(&dimension_order[0], &dimension_order[0] + ndims,
			[&](const int &j, const int &k) {
			  if (angle_values[j] == angle_values[k])
				return dims[j] > dims[k];
			  else
				return angle_values[j] < angle_values[k];
			}
  );
}